

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall IMLE::validForwardSolutions(IMLE *this,int *newSol1,int *newSol2,int *worseSol)

{
  double dVar1;
  pointer piVar2;
  pointer pFVar3;
  bool bVar4;
  long lVar5;
  int j_2;
  long lVar6;
  ulong uVar7;
  int *x;
  int j;
  long lVar8;
  ResScalar RVar9;
  double dVar10;
  Vec T;
  Vec sumWsq;
  Vec dist;
  X diffX;
  double local_e8;
  double local_e0;
  void *local_c8 [2];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_b8;
  Mat *local_a0;
  undefined8 local_98;
  long local_90;
  RhsNested local_88;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_80;
  void *local_78 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_68;
  void *local_58;
  undefined8 uStack_50;
  double local_48;
  int *local_40;
  int *local_38;
  
  local_58 = (void *)0x0;
  uStack_50 = 0;
  x = &this->M;
  local_40 = newSol2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_68,x);
  local_b8.m_lhs = (LhsNested)(long)this->nSolFound;
  local_b8._16_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_b8);
  local_b8.m_lhs = (LhsNested)(long)this->nSolFound;
  local_b8._16_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_b8);
  lVar6 = 0x168;
  for (lVar8 = 0; lVar8 < *x; lVar8 = lVar8 + 1) {
    local_b8.m_lhs =
         (LhsNested)
         ((long)&(((this->experts).
                   super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   .
                   super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar6);
    local_b8.m_rhs =
         (this->predictions).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start +
         (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar8];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_58,&local_b8);
    local_b8.m_rhs =
         (RhsNested)
         (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    local_b8.m_lhs =
         (LhsNested)
         ((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data + (long)local_b8.m_rhs * lVar8);
    local_98 = 0;
    local_a0 = &this->fInvRj;
    local_90 = lVar8;
    local_88 = local_b8.m_rhs;
    local_80 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_58;
    RVar9 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_58,
                  (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                   *)&local_b8);
    local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar8]
         = RVar9;
    lVar5 = (long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
    *(double *)((long)local_c8[0] + lVar5 * 8) =
         local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         [lVar8] + *(double *)((long)local_c8[0] + lVar5 * 8);
    dVar10 = *(double *)
              ((long)(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x30);
    *(double *)((long)local_78[0] + lVar5 * 8) =
         dVar10 * dVar10 + *(double *)((long)local_78[0] + lVar5 * 8);
    lVar6 = lVar6 + 0x308;
  }
  *worseSol = -1;
  lVar6 = 0;
  local_e8 = -1.0;
  for (lVar8 = 0; lVar8 < this->nSolFound; lVar8 = lVar8 + 1) {
    dVar10 = *(double *)
              ((long)(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + lVar6);
    dVar10 = (double)this->D * ((dVar10 * dVar10) / *(double *)((long)local_78[0] + lVar6) + -1.0) +
             1.0;
    if ((1.0 <= dVar10) && (0.0 < *(double *)((long)local_c8[0] + lVar6))) {
      boost::math::
      chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::chi_squared_distribution
                ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                  *)&local_b8,dVar10);
      dVar10 = boost::math::
               cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                         ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                           *)&local_b8,(double *)((long)local_c8[0] + lVar6));
      if (local_e8 <= dVar10) {
        *worseSol = (int)lVar8;
        local_e8 = dVar10;
      }
    }
    lVar6 = lVar6 + 8;
  }
  local_48 = (this->param).multiValuedSignificance;
  if (local_48 < local_e8) {
    piVar2 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = -1.0;
    for (lVar6 = 0; uVar7 = (ulong)*x, lVar6 < (long)uVar7; lVar6 = lVar6 + 1) {
      if ((piVar2[lVar6] == *worseSol) &&
         (dVar1 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data[lVar6], dVar10 < dVar1)) {
        *newSol1 = (int)lVar6;
        dVar10 = dVar1;
      }
    }
    local_e0 = -1.0;
    lVar6 = 0x168;
    local_38 = x;
    for (lVar8 = 0; lVar8 < (int)uVar7; lVar8 = lVar8 + 1) {
      if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] == *worseSol) {
        pFVar3 = (this->experts).
                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 .
                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_b8.m_rhs = &pFVar3[*newSol1].super_LinearExpert.pred_x;
        local_b8.m_lhs = (LhsNested)((long)&(pFVar3->super_LinearExpert).d + lVar6);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_58,&local_b8);
        local_b8.m_rhs =
             (RhsNested)
             (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_b8.m_lhs =
             (LhsNested)
             ((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data + (long)local_b8.m_rhs * lVar8);
        local_98 = 0;
        local_a0 = &this->fInvRj;
        local_90 = lVar8;
        local_88 = local_b8.m_rhs;
        local_80 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_58;
        RVar9 = Eigen::internal::
                dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>,_false>
                ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_58,
                      (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                       *)&local_b8);
        x = local_38;
        if (local_e0 < RVar9) {
          *local_40 = (int)lVar8;
          local_e0 = RVar9;
        }
      }
      uVar7 = (ulong)(uint)*x;
      lVar6 = lVar6 + 0x308;
    }
  }
  bVar4 = local_e8 <= local_48;
  free(local_78[0]);
  free(local_c8[0]);
  free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_58);
  return bVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validForwardSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    X diffX;
    Vec dist(M);
    Vec T = Vec::Zero(nSolFound);
    Vec sumWsq = Vec::Zero(nSolFound);
    for(int j = 0; j < M; j++)
    {
        diffX = experts[j].getPredX() - predictions[sNearest[j]];
        dist(j) = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);

        T[sNearest[j]] += dist(j);
        sumWsq(sNearest[j]) += experts[j].get_p_z()*experts[j].get_p_z();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;

    for(int k = 0; k < nSolFound; k++)
    {
        Scal dof = (sum_p_z(k) * sum_p_z(k) / sumWsq(k) - 1.0) * D;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dMax = -1.0;
        for(int j = 0; j < M; j++)
            if( (sNearest[j] == worseSol) && (dist(j) > dMax) )
            {
                dMax = dist(j);
                newSol1 = j;
            }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        Scal dist2;
        for(int j = 0; j < M; j++)
            if( sNearest[j] == worseSol )
            {
                diffX = experts[j].getPredX() - experts[newSol1].getPredX();
                dist2 = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);
                if( dist2 > dMax )
                {
                    dMax = dist2;
                    newSol2 = j;
                }
            }

        return false;
    }
}